

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_chart_push_line(nk_context *ctx,nk_window *win,nk_chart *g,float value,int slot)

{
  nk_panel *pnVar1;
  nk_rect rect;
  nk_rect rect_00;
  int iVar2;
  uint uVar3;
  nk_command_buffer *b;
  bool bVar4;
  float fVar5;
  float fVar6;
  nk_rect nVar7;
  float ratio;
  float range;
  float step;
  nk_color color;
  nk_rect bounds;
  nk_vec2 cur;
  nk_flags ret;
  nk_command_buffer *out;
  nk_input *i;
  nk_panel *layout;
  int slot_local;
  float value_local;
  nk_chart *g_local;
  nk_window *win_local;
  nk_context *ctx_local;
  
  pnVar1 = win->layout;
  b = &win->buffer;
  cur.x = 0.0;
  if ((-1 < slot) && (slot < 4)) {
    fVar5 = (value - g->slots[slot].min) / (g->slots[slot].max - g->slots[slot].min);
    if (g->slots[slot].index == 0) {
      g->slots[slot].last.x = g->x;
      g->slots[slot].last.y = -fVar5 * g->h + g->y + g->h;
      fVar5 = g->slots[slot].last.x - 2.0;
      fVar6 = g->slots[slot].last.y - 2.0;
      range = *(float *)&g->slots[slot].color;
      if (((((pnVar1->flags & 0x1000) == 0) &&
           (g->slots[slot].last.x - 3.0 <= (ctx->input).mouse.pos.x)) &&
          ((ctx->input).mouse.pos.x < (g->slots[slot].last.x - 3.0) + 6.0)) &&
         ((g->slots[slot].last.y - 3.0 <= (ctx->input).mouse.pos.y &&
          ((ctx->input).mouse.pos.y < (g->slots[slot].last.y - 3.0) + 6.0)))) {
        rect.y = fVar6;
        rect.x = fVar5;
        rect.w = 4.0;
        rect.h = 4.0;
        iVar2 = nk_input_is_mouse_hovering_rect(&ctx->input,rect);
        bVar4 = false;
        if ((ctx->input).mouse.buttons[0].down != 0) {
          bVar4 = (ctx->input).mouse.buttons[0].clicked != 0;
        }
        uVar3 = 0;
        if (bVar4) {
          uVar3 = 2;
        }
        cur.x = (float)(uVar3 | iVar2 != 0);
        range = *(float *)&g->slots[slot].highlight;
      }
      rect_00.y = fVar6;
      rect_00.x = fVar5;
      rect_00.w = 4.0;
      rect_00.h = 4.0;
      nk_fill_rect(b,rect_00,0.0,(nk_color)range);
      g->slots[slot].index = g->slots[slot].index + 1;
      ctx_local._4_4_ = cur.x;
    }
    else {
      range = *(float *)&g->slots[slot].color;
      fVar6 = (g->w / (float)g->slots[slot].count) * (float)g->slots[slot].index + g->x;
      fVar5 = -fVar5 * g->h + g->y + g->h;
      nk_stroke_line(b,g->slots[slot].last.x,g->slots[slot].last.y,fVar6,fVar5,1.0,(nk_color)range);
      if (((pnVar1->flags & 0x1000) == 0) &&
         (nVar7.y = fVar5 - 3.0, nVar7.x = fVar6 - 3.0, nVar7.w = 6.0, nVar7.h = 6.0,
         iVar2 = nk_input_is_mouse_hovering_rect(&ctx->input,nVar7), iVar2 != 0)) {
        bVar4 = false;
        if ((ctx->input).mouse.buttons[0].down == 0) {
          bVar4 = (ctx->input).mouse.buttons[0].clicked != 0;
        }
        uVar3 = 0;
        if (bVar4) {
          uVar3 = 2;
        }
        cur.x = (float)(uVar3 | 1);
        range = *(float *)&g->slots[slot].highlight;
      }
      nVar7 = nk_rect(fVar6 - 2.0,fVar5 - 2.0,4.0,4.0);
      nk_fill_rect(b,nVar7,0.0,(nk_color)range);
      g->slots[slot].last.x = fVar6;
      g->slots[slot].last.y = fVar5;
      g->slots[slot].index = g->slots[slot].index + 1;
      ctx_local._4_4_ = cur.x;
    }
    return (nk_flags)ctx_local._4_4_;
  }
  __assert_fail("slot >= 0 && slot < 4",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x5e4f,
                "nk_flags nk_chart_push_line(struct nk_context *, struct nk_window *, struct nk_chart *, float, int)"
               );
}

Assistant:

NK_INTERN nk_flags
nk_chart_push_line(struct nk_context *ctx, struct nk_window *win,
    struct nk_chart *g, float value, int slot)
{
    struct nk_panel *layout = win->layout;
    const struct nk_input *i = &ctx->input;
    struct nk_command_buffer *out = &win->buffer;

    nk_flags ret = 0;
    struct nk_vec2 cur;
    struct nk_rect bounds;
    struct nk_color color;
    float step;
    float range;
    float ratio;

    NK_ASSERT(slot >= 0 && slot < NK_CHART_MAX_SLOT);
    step = g->w / (float)g->slots[slot].count;
    range = g->slots[slot].max - g->slots[slot].min;
    ratio = (value - g->slots[slot].min) / range;

    if (g->slots[slot].index == 0) {
        /* first data point does not have a connection */
        g->slots[slot].last.x = g->x;
        g->slots[slot].last.y = (g->y + g->h) - ratio * (float)g->h;

        bounds.x = g->slots[slot].last.x - 2;
        bounds.y = g->slots[slot].last.y - 2;
        bounds.w = bounds.h = 4;

        color = g->slots[slot].color;
        if (!(layout->flags & NK_WINDOW_ROM) &&
            NK_INBOX(i->mouse.pos.x,i->mouse.pos.y, g->slots[slot].last.x-3, g->slots[slot].last.y-3, 6, 6)){
            ret = nk_input_is_mouse_hovering_rect(i, bounds) ? NK_CHART_HOVERING : 0;
            ret |= (i->mouse.buttons[NK_BUTTON_LEFT].down &&
                i->mouse.buttons[NK_BUTTON_LEFT].clicked) ? NK_CHART_CLICKED: 0;
            color = g->slots[slot].highlight;
        }
        nk_fill_rect(out, bounds, 0, color);
        g->slots[slot].index += 1;
        return ret;
    }

    /* draw a line between the last data point and the new one */
    color = g->slots[slot].color;
    cur.x = g->x + (float)(step * (float)g->slots[slot].index);
    cur.y = (g->y + g->h) - (ratio * (float)g->h);
    nk_stroke_line(out, g->slots[slot].last.x, g->slots[slot].last.y, cur.x, cur.y, 1.0f, color);

    bounds.x = cur.x - 3;
    bounds.y = cur.y - 3;
    bounds.w = bounds.h = 6;

    /* user selection of current data point */
    if (!(layout->flags & NK_WINDOW_ROM)) {
        if (nk_input_is_mouse_hovering_rect(i, bounds)) {
            ret = NK_CHART_HOVERING;
            ret |= (!i->mouse.buttons[NK_BUTTON_LEFT].down &&
                i->mouse.buttons[NK_BUTTON_LEFT].clicked) ? NK_CHART_CLICKED: 0;
            color = g->slots[slot].highlight;
        }
    }
    nk_fill_rect(out, nk_rect(cur.x - 2, cur.y - 2, 4, 4), 0, color);

    /* save current data point position */
    g->slots[slot].last.x = cur.x;
    g->slots[slot].last.y = cur.y;
    g->slots[slot].index  += 1;
    return ret;
}